

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.h
# Opt level: O2

void __thiscall chrono::ChLinkLockPlanePlane::~ChLinkLockPlanePlane(ChLinkLockPlanePlane *this)

{
  ChLinkLock::~ChLinkLock(&this->super_ChLinkLock);
  Eigen::internal::handmade_aligned_free(this);
  return;
}

Assistant:

class ChApi ChLinkLockPlanePlane : public ChLinkLock {
  public:
    ChLinkLockPlanePlane() { ChangeLinkType(LinkType::PLANEPLANE); }

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLinkLockPlanePlane* Clone() const override { return new ChLinkLockPlanePlane(*this); }

    /// Lock the joint.
    /// If enabled (lock = true) this effectively converts this joint into a weld joint.
    /// If lock = false, the joint reverts to its original degrees of freedom.
    void Lock(bool lock);
}